

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.h
# Opt level: O3

string * aeron::util::strPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *output;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  char buffer [128];
  undefined8 local_188;
  void **local_180;
  undefined1 *local_178;
  char local_168 [128];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_188 = 0x3000000010;
  local_180 = &argp[0].overflow_arg_area;
  local_178 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf(local_168,0x80,format,&local_188);
  if (iVar1 < 0x80) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(local_168);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_168,local_168 + sVar2);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)(iVar1 + 1U));
    local_188 = 0x3000000010;
    local_180 = &argp[0].overflow_arg_area;
    local_178 = local_e8;
    vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,(ulong)(iVar1 + 1U),format,&local_188);
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string strPrintf(const char* format, ...)
{
    const int BUFFER_SIZE = 128;
    char buffer[BUFFER_SIZE];

    va_list argp;
    va_start(argp, format);
    int len = vsnprintf(buffer, BUFFER_SIZE, format, argp);
    va_end(argp);

    if (len >= BUFFER_SIZE)
    {
        len++;
        std::string output(len, ' ');

        va_start(argp, format);
        vsnprintf(&output[0], len, format, argp);
        va_end(argp);

        output.pop_back(); // remove trailing 0 char
        return output;
    }
    else
    {
        return std::string(buffer);
    }
}